

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk3c(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk3c *peVar1;
  int local_2c;
  int i;
  envy_bios_power_unk3c *unk3c;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk3c;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk3c.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse POWER TOPOLOGY table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).unk3c.version);
    }
    else {
      fprintf((FILE *)out,"POWER TOPOLOGY table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).unk3c.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).unk3c.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; local_2c < (int)(uint)(bios->power).unk3c.entriesnum;
          local_2c = local_2c + 1) {
        envy_bios_dump_hex(bios,out,(bios->power).unk3c.entries[local_2c].offset,
                           (uint)(bios->power).unk3c.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk3c(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk3c *unk3c = &bios->power.unk3c;
	int i;

	if (!unk3c->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk3c->valid) {
		fprintf(out, "Failed to parse POWER TOPOLOGY table at 0x%x, version %x\n", unk3c->offset, unk3c->version);
		return;
	}

	fprintf(out, "POWER TOPOLOGY table at 0x%x, version %x\n", unk3c->offset, unk3c->version);
	envy_bios_dump_hex(bios, out, unk3c->offset, unk3c->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk3c->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk3c->entries[i].offset, unk3c->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}